

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  vfloat<4> vVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  vbool<4> vVar30;
  uint uVar31;
  int iVar32;
  undefined4 uVar33;
  long lVar34;
  ulong uVar35;
  NodeRef root;
  size_t sVar36;
  size_t sVar37;
  uint uVar38;
  ulong uVar39;
  NodeRef *pNVar40;
  ulong uVar41;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM0 [64];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar76;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar74;
  float fVar75;
  undefined1 auVar73 [64];
  float fVar77;
  float fVar91;
  float fVar92;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar94;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar93;
  float fVar95;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar114;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar124;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar125;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [16];
  float fVar130;
  undefined1 auVar127 [16];
  float fVar131;
  float fVar139;
  float fVar140;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar141;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar143;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  float fVar152;
  float fVar156;
  float fVar157;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [64];
  float fVar162;
  float fVar163;
  undefined1 auVar164 [16];
  float fVar171;
  undefined1 auVar165 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar172;
  undefined1 auVar166 [64];
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar174 [64];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar181 [16];
  float fVar183;
  float fVar185;
  undefined1 in_ZMM15 [64];
  undefined1 auVar182 [64];
  Precalculations pre;
  float local_3818;
  float fStack_3814;
  float fStack_3810;
  vbool<4> terminated;
  float local_37d8;
  float fStack_37d4;
  float fStack_37d0;
  undefined1 local_37b8 [16];
  BVH *local_37a8;
  Intersectors *local_37a0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_3668 [16];
  undefined1 local_3658 [16];
  undefined1 local_3648 [16];
  undefined1 local_3638 [16];
  undefined1 local_3628 [16];
  undefined1 local_3618 [8];
  float fStack_3610;
  float fStack_360c;
  undefined8 local_3608;
  undefined8 uStack_3600;
  undefined8 uStack_35e0;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  undefined1 local_3528 [16];
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  uint local_34f8;
  uint uStack_34f4;
  uint uStack_34f0;
  uint uStack_34ec;
  uint uStack_34e8;
  uint uStack_34e4;
  uint uStack_34e0;
  uint uStack_34dc;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar147 [16];
  
  local_37a8 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_37a8->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar60 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar50 = vpcmpeqd_avx(auVar60,(undefined1  [16])valid_i->field_0);
    auVar61 = ZEXT816(0) << 0x40;
    auVar12 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar61,5);
    auVar69 = auVar50 & auVar12;
    if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar69[0xf] < '\0')
    {
      auVar12 = vandps_avx(auVar12,auVar50);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar70._8_4_ = 0x7fffffff;
      auVar70._0_8_ = 0x7fffffff7fffffff;
      auVar70._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar70,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar144._8_4_ = 0x219392ef;
      auVar144._0_8_ = 0x219392ef219392ef;
      auVar144._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar50,auVar144,1);
      auVar160._8_4_ = 0x3f800000;
      auVar160._0_8_ = 0x3f8000003f800000;
      auVar160._12_4_ = 0x3f800000;
      auVar115 = vdivps_avx(auVar160,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar50 = vandps_avx(auVar70,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar108 = vcmpps_avx(auVar50,auVar144,1);
      auVar116 = vdivps_avx(auVar160,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vandps_avx(auVar70,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar144,1);
      auVar145._8_4_ = 0x5d5e0b6b;
      auVar145._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar145._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar115,auVar145,auVar69)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar116,auVar145,auVar108);
      auVar69 = vdivps_avx(auVar160,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar69,auVar145,auVar50);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar61,1);
      auVar115._8_4_ = 0x20;
      auVar115._0_8_ = 0x2000000020;
      auVar115._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar115);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar61,5);
      auVar69._8_4_ = 0x40;
      auVar69._0_8_ = 0x4000000040;
      auVar69._12_4_ = 0x40;
      auVar116._8_4_ = 0x60;
      auVar116._0_8_ = 0x6000000060;
      auVar116._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar116,auVar69,auVar50)
      ;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar61,5);
      auVar108._8_4_ = 0x80;
      auVar108._0_8_ = 0x8000000080;
      auVar108._12_4_ = 0x80;
      auVar117._8_4_ = 0xa0;
      auVar117._0_8_ = 0xa0000000a0;
      auVar117._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar117,auVar108,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar61);
      auVar69 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar61);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar161 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,auVar12);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar69,auVar12);
      terminated.field_0.i[1] = auVar12._4_4_ ^ auVar60._4_4_;
      terminated.field_0.i[0] = auVar12._0_4_ ^ auVar60._0_4_;
      terminated.field_0.i[2] = auVar12._8_4_ ^ auVar60._8_4_;
      terminated.field_0.i[3] = auVar12._12_4_ ^ auVar60._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar38 = 3;
      }
      else {
        uVar38 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar40 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar42 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar166 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar60 = vpcmpeqd_avx(in_ZMM15._0_16_,in_ZMM15._0_16_);
      auVar182 = ZEXT1664(auVar60);
      local_37a0 = This;
LAB_0153894a:
      do {
        do {
          root.ptr = pNVar40[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015394f0;
          pNVar40 = pNVar40 + -1;
          paVar42 = paVar42 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar42->v;
          auVar73 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar60 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar31 = vmovmskps_avx(auVar60);
        } while (uVar31 == 0);
        uVar41 = (ulong)(uVar31 & 0xff);
        uVar31 = POPCOUNT(uVar31 & 0xff);
        if (uVar38 < uVar31) {
LAB_0153898a:
          do {
            vVar30.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015394f0;
              auVar60 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar73._0_16_,6);
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar60[0xf]) goto LAB_0153894a;
              uVar41 = (ulong)((uint)root.ptr & 0xf);
              if (uVar41 == 8) goto LAB_015393d7;
              auVar61._0_4_ = auVar182._0_4_ ^ terminated.field_0._0_4_;
              auVar61._4_4_ = auVar182._4_4_ ^ terminated.field_0._4_4_;
              auVar61._8_4_ = auVar182._8_4_ ^ terminated.field_0._8_4_;
              auVar61._12_4_ = auVar182._12_4_ ^ terminated.field_0._12_4_;
              lVar34 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar39 = 0;
              goto LAB_01538b89;
            }
            lVar34 = 0;
            sVar37 = 8;
            auVar60 = auVar161._0_16_;
            do {
              sVar36 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar34 * 8);
              if (sVar36 == 8) {
                auVar73 = ZEXT1664(auVar60);
                sVar36 = sVar37;
                break;
              }
              uVar33 = *(undefined4 *)(root.ptr + 0x40 + lVar34 * 4);
              auVar53._4_4_ = uVar33;
              auVar53._0_4_ = uVar33;
              auVar53._8_4_ = uVar33;
              auVar53._12_4_ = uVar33;
              auVar25._8_8_ = tray.org.field_0._8_8_;
              auVar25._0_8_ = tray.org.field_0._0_8_;
              auVar26._8_8_ = tray.org.field_0._24_8_;
              auVar26._0_8_ = tray.org.field_0._16_8_;
              auVar27._8_8_ = tray.org.field_0._40_8_;
              auVar27._0_8_ = tray.org.field_0._32_8_;
              auVar50 = vsubps_avx(auVar53,auVar25);
              auVar118._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar50._0_4_;
              auVar118._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar50._4_4_;
              auVar118._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar50._8_4_;
              auVar118._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar50._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0x80 + lVar34 * 4);
              auVar54._4_4_ = uVar33;
              auVar54._0_4_ = uVar33;
              auVar54._8_4_ = uVar33;
              auVar54._12_4_ = uVar33;
              auVar50 = vsubps_avx(auVar54,auVar26);
              auVar132._0_4_ = tray.rdir.field_0._16_4_ * auVar50._0_4_;
              auVar132._4_4_ = tray.rdir.field_0._20_4_ * auVar50._4_4_;
              auVar132._8_4_ = tray.rdir.field_0._24_4_ * auVar50._8_4_;
              auVar132._12_4_ = tray.rdir.field_0._28_4_ * auVar50._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0xc0 + lVar34 * 4);
              auVar55._4_4_ = uVar33;
              auVar55._0_4_ = uVar33;
              auVar55._8_4_ = uVar33;
              auVar55._12_4_ = uVar33;
              auVar50 = vsubps_avx(auVar55,auVar27);
              auVar153._0_4_ = tray.rdir.field_0._32_4_ * auVar50._0_4_;
              auVar153._4_4_ = tray.rdir.field_0._36_4_ * auVar50._4_4_;
              auVar153._8_4_ = tray.rdir.field_0._40_4_ * auVar50._8_4_;
              auVar153._12_4_ = tray.rdir.field_0._44_4_ * auVar50._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0x60 + lVar34 * 4);
              auVar56._4_4_ = uVar33;
              auVar56._0_4_ = uVar33;
              auVar56._8_4_ = uVar33;
              auVar56._12_4_ = uVar33;
              auVar50 = vsubps_avx(auVar56,auVar25);
              auVar78._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar50._0_4_;
              auVar78._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar50._4_4_;
              auVar78._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar50._8_4_;
              auVar78._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar50._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0xa0 + lVar34 * 4);
              auVar57._4_4_ = uVar33;
              auVar57._0_4_ = uVar33;
              auVar57._8_4_ = uVar33;
              auVar57._12_4_ = uVar33;
              auVar50 = vsubps_avx(auVar57,auVar26);
              auVar96._0_4_ = tray.rdir.field_0._16_4_ * auVar50._0_4_;
              auVar96._4_4_ = tray.rdir.field_0._20_4_ * auVar50._4_4_;
              auVar96._8_4_ = tray.rdir.field_0._24_4_ * auVar50._8_4_;
              auVar96._12_4_ = tray.rdir.field_0._28_4_ * auVar50._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0xe0 + lVar34 * 4);
              auVar58._4_4_ = uVar33;
              auVar58._0_4_ = uVar33;
              auVar58._8_4_ = uVar33;
              auVar58._12_4_ = uVar33;
              auVar50 = vsubps_avx(auVar58,auVar27);
              auVar103._0_4_ = tray.rdir.field_0._32_4_ * auVar50._0_4_;
              auVar103._4_4_ = tray.rdir.field_0._36_4_ * auVar50._4_4_;
              auVar103._8_4_ = tray.rdir.field_0._40_4_ * auVar50._8_4_;
              auVar103._12_4_ = tray.rdir.field_0._44_4_ * auVar50._12_4_;
              auVar50 = vminps_avx(auVar118,auVar78);
              auVar69 = vminps_avx(auVar132,auVar96);
              auVar50 = vmaxps_avx(auVar50,auVar69);
              auVar69 = vminps_avx(auVar153,auVar103);
              auVar50 = vmaxps_avx(auVar50,auVar69);
              auVar59._0_4_ = auVar166._0_4_ * auVar50._0_4_;
              auVar59._4_4_ = auVar166._4_4_ * auVar50._4_4_;
              auVar59._8_4_ = auVar166._8_4_ * auVar50._8_4_;
              auVar59._12_4_ = auVar166._12_4_ * auVar50._12_4_;
              auVar50 = vmaxps_avx(auVar118,auVar78);
              auVar69 = vmaxps_avx(auVar132,auVar96);
              auVar69 = vminps_avx(auVar50,auVar69);
              auVar50 = vmaxps_avx(auVar153,auVar103);
              auVar50 = vminps_avx(auVar69,auVar50);
              auVar79._0_4_ = auVar174._0_4_ * auVar50._0_4_;
              auVar79._4_4_ = auVar174._4_4_ * auVar50._4_4_;
              auVar79._8_4_ = auVar174._8_4_ * auVar50._8_4_;
              auVar79._12_4_ = auVar174._12_4_ * auVar50._12_4_;
              auVar50 = vmaxps_avx(auVar59,(undefined1  [16])tray.tnear.field_0);
              auVar69 = vminps_avx(auVar79,(undefined1  [16])tray.tfar.field_0);
              auVar50 = vcmpps_avx(auVar50,auVar69,2);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf]) {
                auVar73 = ZEXT1664(auVar60);
                sVar36 = sVar37;
              }
              else {
                auVar50 = vblendvps_avx(auVar161._0_16_,auVar59,auVar50);
                auVar73 = ZEXT1664(auVar50);
                if (sVar37 != 8) {
                  pNVar40->ptr = sVar37;
                  pNVar40 = pNVar40 + 1;
                  *(undefined1 (*) [16])paVar42->v = auVar60;
                  paVar42 = paVar42 + 1;
                }
              }
              lVar34 = lVar34 + 1;
              auVar60 = auVar73._0_16_;
              sVar37 = sVar36;
            } while (lVar34 != 8);
            iVar32 = 4;
            if (sVar36 == 8) goto LAB_01538b1f;
            auVar60 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar73._0_16_,6);
            uVar33 = vmovmskps_avx(auVar60);
            root.ptr = sVar36;
          } while ((byte)uVar38 < (byte)POPCOUNT(uVar33));
          pNVar40->ptr = sVar36;
          pNVar40 = pNVar40 + 1;
          *paVar42 = auVar73._0_16_;
          paVar42 = paVar42 + 1;
        }
        else {
          do {
            sVar37 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> sVar37 & 1) == 0; sVar37 = sVar37 + 1) {
              }
            }
            auVar182 = ZEXT1664(auVar182._0_16_);
            bVar43 = occluded1(local_37a0,local_37a8,root,sVar37,&pre,ray,&tray,context);
            if (bVar43) {
              terminated.field_0.i[sVar37] = -1;
            }
            uVar41 = uVar41 & uVar41 - 1;
          } while (uVar41 != 0);
          auVar60 = vpcmpeqd_avx(auVar182._0_16_,auVar182._0_16_);
          auVar182 = ZEXT1664(auVar60);
          auVar60 = auVar60 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar60[0xf]) {
            iVar32 = 3;
          }
          else {
            auVar60._8_4_ = 0xff800000;
            auVar60._0_8_ = 0xff800000ff800000;
            auVar60._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar60,
                               (undefined1  [16])terminated.field_0);
            iVar32 = 2;
          }
          auVar161 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar166 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar73 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar38 < uVar31) goto LAB_0153898a;
        }
LAB_01538b1f:
      } while ((iVar32 == 4) || (iVar32 == 2));
LAB_015394f0:
      auVar12 = vandps_avx(auVar12,(undefined1  [16])terminated.field_0);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      auVar12 = vmaskmovps_avx(auVar12,auVar72);
      *(undefined1 (*) [16])pRVar1 = auVar12;
    }
  }
  return;
  while( true ) {
    uVar39 = uVar39 + 1;
    lVar34 = lVar34 + 0xb0;
    auVar61 = auVar50;
    if (uVar41 - 8 <= uVar39) break;
LAB_01538b89:
    uVar35 = 0;
    auVar60 = auVar61;
    while( true ) {
      uVar31 = *(uint *)(lVar34 + -0x10 + uVar35 * 4);
      if ((ulong)uVar31 == 0xffffffff) break;
      uVar33 = *(undefined4 *)(lVar34 + -0xa0 + uVar35 * 4);
      auVar44._4_4_ = uVar33;
      auVar44._0_4_ = uVar33;
      auVar44._8_4_ = uVar33;
      auVar44._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x90 + uVar35 * 4);
      auVar62._4_4_ = uVar33;
      auVar62._0_4_ = uVar33;
      auVar62._8_4_ = uVar33;
      auVar62._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x80 + uVar35 * 4);
      auVar80._4_4_ = uVar33;
      auVar80._0_4_ = uVar33;
      auVar80._8_4_ = uVar33;
      auVar80._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x70 + uVar35 * 4);
      auVar97._4_4_ = uVar33;
      auVar97._0_4_ = uVar33;
      auVar97._8_4_ = uVar33;
      auVar97._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x60 + uVar35 * 4);
      auVar104._4_4_ = uVar33;
      auVar104._0_4_ = uVar33;
      auVar104._8_4_ = uVar33;
      auVar104._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x50 + uVar35 * 4);
      auVar109._4_4_ = uVar33;
      auVar109._0_4_ = uVar33;
      auVar109._8_4_ = uVar33;
      auVar109._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x40 + uVar35 * 4);
      auVar119._4_4_ = uVar33;
      auVar119._0_4_ = uVar33;
      auVar119._8_4_ = uVar33;
      auVar119._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x30 + uVar35 * 4);
      auVar164._4_4_ = uVar33;
      auVar164._0_4_ = uVar33;
      auVar164._8_4_ = uVar33;
      auVar164._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar34 + -0x20 + uVar35 * 4);
      auVar133._4_4_ = uVar33;
      auVar133._0_4_ = uVar33;
      auVar133._8_4_ = uVar33;
      auVar133._12_4_ = uVar33;
      auVar50 = *(undefined1 (*) [16])ray;
      auVar69 = *(undefined1 (*) [16])(ray + 0x10);
      auVar108 = *(undefined1 (*) [16])(ray + 0x20);
      auVar115 = vsubps_avx(auVar44,auVar50);
      auVar116 = vsubps_avx(auVar62,auVar69);
      auVar117 = vsubps_avx(auVar80,auVar108);
      auVar70 = vsubps_avx(auVar97,auVar50);
      auVar144 = vsubps_avx(auVar104,auVar69);
      auVar145 = vsubps_avx(auVar109,auVar108);
      auVar160 = vsubps_avx(auVar119,auVar50);
      auVar69 = vsubps_avx(auVar164,auVar69);
      auVar108 = vsubps_avx(auVar133,auVar108);
      auVar50 = vsubps_avx(auVar160,auVar115);
      auVar44 = vsubps_avx(auVar69,auVar116);
      auVar45 = vsubps_avx(auVar108,auVar117);
      fVar178 = auVar116._0_4_;
      fVar114 = fVar178 + auVar69._0_4_;
      fVar183 = auVar116._4_4_;
      fVar122 = fVar183 + auVar69._4_4_;
      fVar185 = auVar116._8_4_;
      fVar123 = fVar185 + auVar69._8_4_;
      fVar187 = auVar116._12_4_;
      fVar124 = fVar187 + auVar69._12_4_;
      fVar6 = auVar117._0_4_;
      fVar131 = auVar108._0_4_ + fVar6;
      fVar8 = auVar117._4_4_;
      fVar139 = auVar108._4_4_ + fVar8;
      fVar93 = auVar117._8_4_;
      fVar140 = auVar108._8_4_ + fVar93;
      fVar10 = auVar117._12_4_;
      fVar141 = auVar108._12_4_ + fVar10;
      fVar52 = auVar45._0_4_;
      auVar146._0_4_ = fVar114 * fVar52;
      fVar13 = auVar45._4_4_;
      auVar146._4_4_ = fVar122 * fVar13;
      fVar14 = auVar45._8_4_;
      auVar146._8_4_ = fVar123 * fVar14;
      fVar15 = auVar45._12_4_;
      auVar146._12_4_ = fVar124 * fVar15;
      fVar173 = auVar44._0_4_;
      auVar154._0_4_ = fVar173 * fVar131;
      fVar175 = auVar44._4_4_;
      auVar154._4_4_ = fVar175 * fVar139;
      fVar176 = auVar44._8_4_;
      auVar154._8_4_ = fVar176 * fVar140;
      fVar177 = auVar44._12_4_;
      auVar154._12_4_ = fVar177 * fVar141;
      auVar44 = vsubps_avx(auVar154,auVar146);
      fVar7 = auVar115._0_4_;
      fVar142 = auVar160._0_4_ + fVar7;
      fVar9 = auVar115._4_4_;
      fVar148 = auVar160._4_4_ + fVar9;
      fVar95 = auVar115._8_4_;
      fVar150 = auVar160._8_4_ + fVar95;
      fVar11 = auVar115._12_4_;
      fVar151 = auVar160._12_4_ + fVar11;
      fVar162 = auVar50._0_4_;
      auVar134._0_4_ = fVar162 * fVar131;
      fVar167 = auVar50._4_4_;
      auVar134._4_4_ = fVar167 * fVar139;
      fVar169 = auVar50._8_4_;
      auVar134._8_4_ = fVar169 * fVar140;
      fVar171 = auVar50._12_4_;
      auVar134._12_4_ = fVar171 * fVar141;
      auVar155._0_4_ = fVar142 * fVar52;
      auVar155._4_4_ = fVar148 * fVar13;
      auVar155._8_4_ = fVar150 * fVar14;
      auVar155._12_4_ = fVar151 * fVar15;
      auVar45 = vsubps_avx(auVar155,auVar134);
      auVar135._0_4_ = fVar142 * fVar173;
      auVar135._4_4_ = fVar148 * fVar175;
      auVar135._8_4_ = fVar150 * fVar176;
      auVar135._12_4_ = fVar151 * fVar177;
      auVar120._0_4_ = fVar162 * fVar114;
      auVar120._4_4_ = fVar167 * fVar122;
      auVar120._8_4_ = fVar169 * fVar123;
      auVar120._12_4_ = fVar171 * fVar124;
      auVar46 = vsubps_avx(auVar120,auVar135);
      auVar50 = *(undefined1 (*) [16])(ray + 0x60);
      fVar114 = auVar50._0_4_;
      fVar124 = auVar50._4_4_;
      fVar140 = auVar50._8_4_;
      fVar148 = auVar50._12_4_;
      fVar17 = *(float *)(ray + 0x50);
      fVar18 = *(float *)(ray + 0x54);
      fVar19 = *(float *)(ray + 0x58);
      auVar28 = *(undefined1 (*) [12])(ray + 0x50);
      fVar20 = *(float *)(ray + 0x5c);
      fVar21 = *(float *)(ray + 0x40);
      fVar22 = *(float *)(ray + 0x44);
      fVar23 = *(float *)(ray + 0x48);
      auVar29 = *(undefined1 (*) [12])(ray + 0x40);
      fVar24 = *(float *)(ray + 0x4c);
      fVar143 = fVar21 * auVar44._0_4_ + fVar17 * auVar45._0_4_ + auVar46._0_4_ * fVar114;
      fVar149 = fVar22 * auVar44._4_4_ + fVar18 * auVar45._4_4_ + auVar46._4_4_ * fVar124;
      auVar147._0_8_ = CONCAT44(fVar149,fVar143);
      auVar147._8_4_ = fVar23 * auVar44._8_4_ + fVar19 * auVar45._8_4_ + auVar46._8_4_ * fVar140;
      auVar147._12_4_ = fVar24 * auVar44._12_4_ + fVar20 * auVar45._12_4_ + auVar46._12_4_ * fVar148
      ;
      auVar50 = vsubps_avx(auVar116,auVar144);
      auVar116 = vsubps_avx(auVar117,auVar145);
      fVar123 = fVar178 + auVar144._0_4_;
      fVar139 = fVar183 + auVar144._4_4_;
      fVar142 = fVar185 + auVar144._8_4_;
      fVar151 = fVar187 + auVar144._12_4_;
      fVar179 = auVar145._0_4_ + fVar6;
      fVar184 = auVar145._4_4_ + fVar8;
      fVar186 = auVar145._8_4_ + fVar93;
      fVar188 = auVar145._12_4_ + fVar10;
      fVar152 = auVar116._0_4_;
      auVar165._0_4_ = fVar152 * fVar123;
      fVar156 = auVar116._4_4_;
      auVar165._4_4_ = fVar156 * fVar139;
      fVar157 = auVar116._8_4_;
      auVar165._8_4_ = fVar157 * fVar142;
      fVar158 = auVar116._12_4_;
      auVar165._12_4_ = fVar158 * fVar151;
      fVar122 = auVar50._0_4_;
      auVar81._0_4_ = fVar179 * fVar122;
      fVar131 = auVar50._4_4_;
      auVar81._4_4_ = fVar184 * fVar131;
      fVar141 = auVar50._8_4_;
      auVar81._8_4_ = fVar186 * fVar141;
      fVar150 = auVar50._12_4_;
      auVar81._12_4_ = fVar188 * fVar150;
      auVar50 = vsubps_avx(auVar81,auVar165);
      auVar115 = vsubps_avx(auVar115,auVar70);
      fVar163 = auVar115._0_4_;
      auVar181._0_4_ = fVar163 * fVar179;
      fVar168 = auVar115._4_4_;
      auVar181._4_4_ = fVar168 * fVar184;
      fVar170 = auVar115._8_4_;
      auVar181._8_4_ = fVar170 * fVar186;
      fVar172 = auVar115._12_4_;
      auVar181._12_4_ = fVar172 * fVar188;
      fVar179 = fVar7 + auVar70._0_4_;
      fVar184 = fVar9 + auVar70._4_4_;
      fVar186 = fVar95 + auVar70._8_4_;
      fVar188 = fVar11 + auVar70._12_4_;
      auVar136._0_4_ = fVar152 * fVar179;
      auVar136._4_4_ = fVar156 * fVar184;
      auVar136._8_4_ = fVar157 * fVar186;
      auVar136._12_4_ = fVar158 * fVar188;
      auVar115 = vsubps_avx(auVar136,auVar181);
      auVar126._0_4_ = fVar179 * fVar122;
      auVar126._4_4_ = fVar184 * fVar131;
      auVar126._8_4_ = fVar186 * fVar141;
      auVar126._12_4_ = fVar188 * fVar150;
      auVar121._0_4_ = fVar163 * fVar123;
      auVar121._4_4_ = fVar168 * fVar139;
      auVar121._8_4_ = fVar170 * fVar142;
      auVar121._12_4_ = fVar172 * fVar151;
      auVar116 = vsubps_avx(auVar121,auVar126);
      auVar137._0_4_ = fVar21 * auVar50._0_4_ + auVar116._0_4_ * fVar114 + fVar17 * auVar115._0_4_;
      auVar137._4_4_ = fVar22 * auVar50._4_4_ + auVar116._4_4_ * fVar124 + fVar18 * auVar115._4_4_;
      auVar137._8_4_ = fVar23 * auVar50._8_4_ + auVar116._8_4_ * fVar140 + fVar19 * auVar115._8_4_;
      auVar137._12_4_ =
           fVar24 * auVar50._12_4_ + auVar116._12_4_ * fVar148 + fVar20 * auVar115._12_4_;
      auVar115 = vsubps_avx(auVar70,auVar160);
      fVar51 = auVar70._0_4_ + auVar160._0_4_;
      fVar74 = auVar70._4_4_ + auVar160._4_4_;
      fVar75 = auVar70._8_4_ + auVar160._8_4_;
      fVar76 = auVar70._12_4_ + auVar160._12_4_;
      auVar50 = vsubps_avx(auVar144,auVar69);
      fVar179 = auVar144._0_4_ + auVar69._0_4_;
      fVar184 = auVar144._4_4_ + auVar69._4_4_;
      fVar186 = auVar144._8_4_ + auVar69._8_4_;
      fVar188 = auVar144._12_4_ + auVar69._12_4_;
      auVar69 = vsubps_avx(auVar145,auVar108);
      fVar77 = auVar145._0_4_ + auVar108._0_4_;
      fVar91 = auVar145._4_4_ + auVar108._4_4_;
      fVar92 = auVar145._8_4_ + auVar108._8_4_;
      fVar94 = auVar145._12_4_ + auVar108._12_4_;
      fVar123 = auVar69._0_4_;
      auVar98._0_4_ = fVar179 * fVar123;
      fVar139 = auVar69._4_4_;
      auVar98._4_4_ = fVar184 * fVar139;
      fVar142 = auVar69._8_4_;
      auVar98._8_4_ = fVar186 * fVar142;
      fVar151 = auVar69._12_4_;
      auVar98._12_4_ = fVar188 * fVar151;
      fVar125 = auVar50._0_4_;
      auVar110._0_4_ = fVar125 * fVar77;
      fVar128 = auVar50._4_4_;
      auVar110._4_4_ = fVar128 * fVar91;
      fVar129 = auVar50._8_4_;
      auVar110._8_4_ = fVar129 * fVar92;
      fVar130 = auVar50._12_4_;
      auVar110._12_4_ = fVar130 * fVar94;
      auVar50 = vsubps_avx(auVar110,auVar98);
      fVar180 = auVar115._0_4_;
      auVar82._0_4_ = fVar180 * fVar77;
      fVar77 = auVar115._4_4_;
      auVar82._4_4_ = fVar77 * fVar91;
      fVar91 = auVar115._8_4_;
      auVar82._8_4_ = fVar91 * fVar92;
      fVar92 = auVar115._12_4_;
      auVar82._12_4_ = fVar92 * fVar94;
      auVar111._0_4_ = fVar51 * fVar123;
      auVar111._4_4_ = fVar74 * fVar139;
      auVar111._8_4_ = fVar75 * fVar142;
      auVar111._12_4_ = fVar76 * fVar151;
      auVar69 = vsubps_avx(auVar111,auVar82);
      auVar112._8_4_ = 0x7fffffff;
      auVar112._0_8_ = 0x7fffffff7fffffff;
      auVar112._12_4_ = 0x7fffffff;
      auVar63._0_4_ = fVar51 * fVar125;
      auVar63._4_4_ = fVar74 * fVar128;
      auVar63._8_4_ = fVar75 * fVar129;
      auVar63._12_4_ = fVar76 * fVar130;
      auVar45._0_4_ = fVar180 * fVar179;
      auVar45._4_4_ = fVar77 * fVar184;
      auVar45._8_4_ = fVar91 * fVar186;
      auVar45._12_4_ = fVar92 * fVar188;
      auVar108 = vsubps_avx(auVar45,auVar63);
      auVar46._0_4_ = fVar21 * auVar50._0_4_ + auVar108._0_4_ * fVar114 + fVar17 * auVar69._0_4_;
      auVar46._4_4_ = fVar22 * auVar50._4_4_ + auVar108._4_4_ * fVar124 + fVar18 * auVar69._4_4_;
      auVar46._8_4_ = fVar23 * auVar50._8_4_ + auVar108._8_4_ * fVar140 + fVar19 * auVar69._8_4_;
      auVar46._12_4_ = fVar24 * auVar50._12_4_ + auVar108._12_4_ * fVar148 + fVar20 * auVar69._12_4_
      ;
      auVar159._0_4_ = auVar46._0_4_ + fVar143 + auVar137._0_4_;
      auVar159._4_4_ = auVar46._4_4_ + fVar149 + auVar137._4_4_;
      auVar159._8_4_ = auVar46._8_4_ + auVar147._8_4_ + auVar137._8_4_;
      auVar159._12_4_ = auVar46._12_4_ + auVar147._12_4_ + auVar137._12_4_;
      auVar50 = vandps_avx(auVar159,auVar112);
      auVar64._0_4_ = auVar50._0_4_ * 1.1920929e-07;
      auVar64._4_4_ = auVar50._4_4_ * 1.1920929e-07;
      auVar64._8_4_ = auVar50._8_4_ * 1.1920929e-07;
      auVar64._12_4_ = auVar50._12_4_ * 1.1920929e-07;
      auVar50 = vminps_avx(auVar147,auVar137);
      auVar50 = vminps_avx(auVar50,auVar46);
      uVar16 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
      auVar99._0_8_ = uVar16 ^ 0x8000000080000000;
      auVar99._8_4_ = -auVar64._8_4_;
      auVar99._12_4_ = -auVar64._12_4_;
      auVar50 = vcmpps_avx(auVar50,auVar99,5);
      auVar69 = vmaxps_avx(auVar147,auVar137);
      auVar69 = vmaxps_avx(auVar69,auVar46);
      auVar69 = vcmpps_avx(auVar69,auVar64,2);
      auVar50 = vorps_avx(auVar50,auVar69);
      auVar69 = auVar60 & auVar50;
      auVar50 = vandps_avx(auVar50,auVar60);
      if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar69[0xf])
      {
        auVar69 = vpcmpeqd_avx(auVar115,auVar115);
      }
      else {
        auVar47._0_4_ = fVar122 * fVar52;
        auVar47._4_4_ = fVar131 * fVar13;
        auVar47._8_4_ = fVar141 * fVar14;
        auVar47._12_4_ = fVar150 * fVar15;
        auVar65._0_4_ = fVar173 * fVar152;
        auVar65._4_4_ = fVar175 * fVar156;
        auVar65._8_4_ = fVar176 * fVar157;
        auVar65._12_4_ = fVar177 * fVar158;
        auVar116 = vsubps_avx(auVar65,auVar47);
        auVar83._0_4_ = fVar125 * fVar152;
        auVar83._4_4_ = fVar128 * fVar156;
        auVar83._8_4_ = fVar129 * fVar157;
        auVar83._12_4_ = fVar130 * fVar158;
        auVar100._0_4_ = fVar122 * fVar123;
        auVar100._4_4_ = fVar131 * fVar139;
        auVar100._8_4_ = fVar141 * fVar142;
        auVar100._12_4_ = fVar150 * fVar151;
        auVar117 = vsubps_avx(auVar100,auVar83);
        auVar69 = vandps_avx(auVar47,auVar112);
        auVar108 = vandps_avx(auVar83,auVar112);
        auVar69 = vcmpps_avx(auVar69,auVar108,1);
        auVar116 = vblendvps_avx(auVar117,auVar116,auVar69);
        auVar48._0_4_ = fVar163 * fVar123;
        auVar48._4_4_ = fVar168 * fVar139;
        auVar48._8_4_ = fVar170 * fVar142;
        auVar48._12_4_ = fVar172 * fVar151;
        auVar66._0_4_ = fVar163 * fVar52;
        auVar66._4_4_ = fVar168 * fVar13;
        auVar66._8_4_ = fVar170 * fVar14;
        auVar66._12_4_ = fVar172 * fVar15;
        auVar84._0_4_ = fVar152 * fVar162;
        auVar84._4_4_ = fVar156 * fVar167;
        auVar84._8_4_ = fVar157 * fVar169;
        auVar84._12_4_ = fVar158 * fVar171;
        auVar117 = vsubps_avx(auVar66,auVar84);
        auVar105._0_4_ = fVar180 * fVar152;
        auVar105._4_4_ = fVar77 * fVar156;
        auVar105._8_4_ = fVar91 * fVar157;
        auVar105._12_4_ = fVar92 * fVar158;
        auVar70 = vsubps_avx(auVar105,auVar48);
        auVar69 = vandps_avx(auVar84,auVar112);
        auVar108 = vandps_avx(auVar48,auVar112);
        auVar69 = vcmpps_avx(auVar69,auVar108,1);
        auVar117 = vblendvps_avx(auVar70,auVar117,auVar69);
        auVar67._0_4_ = fVar180 * fVar122;
        auVar67._4_4_ = fVar77 * fVar131;
        auVar67._8_4_ = fVar91 * fVar141;
        auVar67._12_4_ = fVar92 * fVar150;
        auVar85._0_4_ = fVar122 * fVar162;
        auVar85._4_4_ = fVar131 * fVar167;
        auVar85._8_4_ = fVar141 * fVar169;
        auVar85._12_4_ = fVar150 * fVar171;
        auVar106._0_4_ = fVar163 * fVar173;
        auVar106._4_4_ = fVar168 * fVar175;
        auVar106._8_4_ = fVar170 * fVar176;
        auVar106._12_4_ = fVar172 * fVar177;
        auVar113._0_4_ = fVar163 * fVar125;
        auVar113._4_4_ = fVar168 * fVar128;
        auVar113._8_4_ = fVar170 * fVar129;
        auVar113._12_4_ = fVar172 * fVar130;
        auVar70 = vsubps_avx(auVar85,auVar106);
        auVar144 = vsubps_avx(auVar113,auVar67);
        auVar69 = vandps_avx(auVar112,auVar106);
        auVar108 = vandps_avx(auVar112,auVar67);
        auVar69 = vcmpps_avx(auVar69,auVar108,1);
        auVar108 = vblendvps_avx(auVar144,auVar70,auVar69);
        local_3818 = auVar28._0_4_;
        fStack_3814 = auVar28._4_4_;
        fStack_3810 = auVar28._8_4_;
        local_37d8 = auVar29._0_4_;
        fStack_37d4 = auVar29._4_4_;
        fStack_37d0 = auVar29._8_4_;
        fVar52 = auVar116._0_4_ * local_37d8 +
                 auVar108._0_4_ * fVar114 + auVar117._0_4_ * local_3818;
        fVar114 = auVar116._4_4_ * fStack_37d4 +
                  auVar108._4_4_ * fVar124 + auVar117._4_4_ * fStack_3814;
        fVar122 = auVar116._8_4_ * fStack_37d0 +
                  auVar108._8_4_ * fVar140 + auVar117._8_4_ * fStack_3810;
        fVar123 = auVar116._12_4_ * fVar24 + auVar108._12_4_ * fVar148 + auVar117._12_4_ * fVar20;
        auVar68._0_4_ = fVar52 + fVar52;
        auVar68._4_4_ = fVar114 + fVar114;
        auVar68._8_4_ = fVar122 + fVar122;
        auVar68._12_4_ = fVar123 + fVar123;
        fVar52 = auVar116._0_4_ * fVar7 + auVar108._0_4_ * fVar6 + auVar117._0_4_ * fVar178;
        fVar114 = auVar116._4_4_ * fVar9 + auVar108._4_4_ * fVar8 + auVar117._4_4_ * fVar183;
        fVar93 = auVar116._8_4_ * fVar95 + auVar108._8_4_ * fVar93 + auVar117._8_4_ * fVar185;
        fVar95 = auVar116._12_4_ * fVar11 + auVar108._12_4_ * fVar10 + auVar117._12_4_ * fVar187;
        auVar69 = vrcpps_avx(auVar68);
        fVar6 = auVar69._0_4_;
        auVar127._0_4_ = auVar68._0_4_ * fVar6;
        fVar7 = auVar69._4_4_;
        auVar127._4_4_ = auVar68._4_4_ * fVar7;
        fVar8 = auVar69._8_4_;
        auVar127._8_4_ = auVar68._8_4_ * fVar8;
        fVar9 = auVar69._12_4_;
        auVar127._12_4_ = auVar68._12_4_ * fVar9;
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar69 = vsubps_avx(auVar138,auVar127);
        auVar86._0_4_ = (fVar52 + fVar52) * (fVar6 + fVar6 * auVar69._0_4_);
        auVar86._4_4_ = (fVar114 + fVar114) * (fVar7 + fVar7 * auVar69._4_4_);
        auVar86._8_4_ = (fVar93 + fVar93) * (fVar8 + fVar8 * auVar69._8_4_);
        auVar86._12_4_ = (fVar95 + fVar95) * (fVar9 + fVar9 * auVar69._12_4_);
        auVar69 = vcmpps_avx(auVar86,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar70 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar86,2);
        auVar69 = vandps_avx(auVar70,auVar69);
        auVar70 = vcmpps_avx(auVar68,_DAT_01f7aa10,4);
        auVar69 = vandps_avx(auVar70,auVar69);
        auVar69 = vpslld_avx(auVar69,0x1f);
        auVar70 = vpsrad_avx(auVar69,0x1f);
        auVar69 = auVar50 & auVar70;
        auVar50 = vandps_avx(auVar50,auVar70);
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar69[0xf] < '\0') {
          uStack_35e0 = auVar147._8_8_;
          uStack_3600 = uStack_35e0;
          local_3668 = auVar108;
          local_3658 = auVar117;
          local_3648 = auVar116;
          local_3638 = auVar86;
          local_3628 = auVar159;
          _local_3618 = auVar137;
          local_3608 = auVar147._0_8_;
        }
        auVar69 = vpcmpeqd_avx(auVar115,auVar115);
      }
      auVar182 = ZEXT1664(auVar69);
      auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar166 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar161 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      pGVar4 = (context->scene->geometries).items[uVar31].ptr;
      uVar2 = pGVar4->mask;
      auVar49._4_4_ = uVar2;
      auVar49._0_4_ = uVar2;
      auVar49._8_4_ = uVar2;
      auVar49._12_4_ = uVar2;
      auVar108 = vandps_avx(auVar49,*(undefined1 (*) [16])(ray + 0x90));
      auVar108 = vpcmpeqd_avx(auVar108,_DAT_01f7aa10);
      auVar115 = auVar50 & ~auVar108;
      if ((((auVar115 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar115 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar115 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar115[0xf] < '\0') {
        auVar50 = vandnps_avx(auVar108,auVar50);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar108 = vandps_avx(local_3628,auVar112);
          auVar115 = vrcpps_avx(local_3628);
          fVar6 = auVar115._0_4_;
          auVar101._0_4_ = local_3628._0_4_ * fVar6;
          fVar7 = auVar115._4_4_;
          auVar101._4_4_ = local_3628._4_4_ * fVar7;
          fVar8 = auVar115._8_4_;
          auVar101._8_4_ = local_3628._8_4_ * fVar8;
          fVar9 = auVar115._12_4_;
          auVar101._12_4_ = local_3628._12_4_ * fVar9;
          auVar107._8_4_ = 0x3f800000;
          auVar107._0_8_ = 0x3f8000003f800000;
          auVar107._12_4_ = 0x3f800000;
          auVar115 = vsubps_avx(auVar107,auVar101);
          auVar87._0_4_ = fVar6 + fVar6 * auVar115._0_4_;
          auVar87._4_4_ = fVar7 + fVar7 * auVar115._4_4_;
          auVar87._8_4_ = fVar8 + fVar8 * auVar115._8_4_;
          auVar87._12_4_ = fVar9 + fVar9 * auVar115._12_4_;
          auVar102._8_4_ = 0x219392ef;
          auVar102._0_8_ = 0x219392ef219392ef;
          auVar102._12_4_ = 0x219392ef;
          auVar108 = vcmpps_avx(auVar108,auVar102,5);
          auVar108 = vandps_avx(auVar108,auVar87);
          auVar88._0_4_ = auVar108._0_4_ * (float)local_3608;
          auVar88._4_4_ = auVar108._4_4_ * local_3608._4_4_;
          auVar88._8_4_ = auVar108._8_4_ * (float)uStack_3600;
          auVar88._12_4_ = auVar108._12_4_ * uStack_3600._4_4_;
          local_3538 = vminps_avx(auVar88,auVar107);
          auVar71._0_4_ = auVar108._0_4_ * (float)local_3618._0_4_;
          auVar71._4_4_ = auVar108._4_4_ * (float)local_3618._4_4_;
          auVar71._8_4_ = auVar108._8_4_ * fStack_3610;
          auVar71._12_4_ = auVar108._12_4_ * fStack_360c;
          local_3528 = vminps_avx(auVar71,auVar107);
          local_3508 = vpshufd_avx(ZEXT416(uVar31),0);
          local_3518 = vpshufd_avx(ZEXT416(*(uint *)(lVar34 + uVar35 * 4)),0);
          local_3568 = local_3648._0_8_;
          uStack_3560 = local_3648._8_8_;
          local_3558 = local_3658._0_8_;
          uStack_3550 = local_3658._8_8_;
          local_3548 = local_3668;
          vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          uStack_34f4 = context->user->instID[0];
          local_34f8 = uStack_34f4;
          uStack_34f0 = uStack_34f4;
          uStack_34ec = uStack_34f4;
          uStack_34e8 = context->user->instPrimID[0];
          uStack_34e4 = uStack_34e8;
          uStack_34e0 = uStack_34e8;
          uStack_34dc = uStack_34e8;
          auVar108 = *(undefined1 (*) [16])(ray + 0x80);
          auVar115 = vblendvps_avx(auVar108,local_3638,auVar50);
          *(undefined1 (*) [16])(ray + 0x80) = auVar115;
          args.valid = (int *)local_37b8;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3568;
          args.N = 4;
          local_37b8 = auVar50;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar166 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar161 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_37b8 == (undefined1  [16])0x0) {
            auVar50 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar69 = vpcmpeqd_avx(auVar69,auVar69);
            auVar182 = ZEXT1664(auVar69);
            auVar69 = auVar69 ^ auVar50;
          }
          else {
            p_Var5 = context->args->filter;
            auVar50 = vpcmpeqd_avx(auVar69,auVar69);
            auVar182 = ZEXT1664(auVar50);
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar50 = vpcmpeqd_avx(auVar50,auVar50);
              auVar182 = ZEXT1664(auVar50);
              auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar166 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar161 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar50 = vpcmpeqd_avx(local_37b8,_DAT_01f7aa10);
            auVar69 = auVar182._0_16_ ^ auVar50;
            auVar89._8_4_ = 0xff800000;
            auVar89._0_8_ = 0xff800000ff800000;
            auVar89._12_4_ = 0xff800000;
            auVar50 = vblendvps_avx(auVar89,*(undefined1 (*) [16])(args.ray + 0x80),auVar50);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
          }
          auVar69 = vpslld_avx(auVar69,0x1f);
          auVar50 = vpsrad_avx(auVar69,0x1f);
          auVar69 = vblendvps_avx(auVar108,*(undefined1 (*) [16])pRVar1,auVar69);
          *(undefined1 (*) [16])pRVar1 = auVar69;
        }
        auVar60 = vpandn_avx(auVar50,auVar60);
      }
      if (((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf])
         || (bVar43 = 2 < uVar35, uVar35 = uVar35 + 1, bVar43)) break;
    }
    auVar50 = vandps_avx(auVar60,auVar61);
    auVar61 = auVar61 & auVar60;
    if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar61[0xf])
    break;
  }
  terminated.field_0.i[0] = auVar182._0_4_ ^ auVar50._0_4_;
  terminated.field_0.i[1] = auVar182._4_4_ ^ auVar50._4_4_;
  terminated.field_0.i[2] = auVar182._8_4_ ^ auVar50._8_4_;
  terminated.field_0.i[3] = auVar182._12_4_ ^ auVar50._12_4_;
LAB_015393d7:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])vVar30.field_0,(undefined1  [16])terminated.field_0);
  auVar60 = auVar182._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf])
  goto LAB_015394f0;
  auVar90._8_4_ = 0xff800000;
  auVar90._0_8_ = 0xff800000ff800000;
  auVar90._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar90,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0153894a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }